

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char * pugi::impl::anon_unknown_0::convert_path_heap(wchar_t *str)

{
  size_t length_00;
  size_t sVar1;
  char *pcVar2;
  wchar_t *in_RDI;
  char *result;
  size_t size;
  size_t length;
  size_t in_stack_ffffffffffffffd8;
  wchar_t *in_stack_ffffffffffffffe0;
  size_t in_stack_fffffffffffffff8;
  
  length_00 = strlength_wide(in_RDI);
  sVar1 = as_utf8_begin(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pcVar2 = (char *)(*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                             allocate)(sVar1 + 1);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    as_utf8_end(result,in_stack_fffffffffffffff8,in_RDI,length_00);
    pcVar2[sVar1] = '\0';
  }
  return pcVar2;
}

Assistant:

PUGI__FN char* convert_path_heap(const wchar_t* str)
	{
		assert(str);

		// first pass: get length in utf8 characters
		size_t length = strlength_wide(str);
		size_t size = as_utf8_begin(str, length);

		// allocate resulting string
		char* result = static_cast<char*>(xml_memory::allocate(size + 1));
		if (!result) return 0;

		// second pass: convert to utf8
		as_utf8_end(result, size, str, length);

		// zero-terminate
		result[size] = 0;

		return result;
	}